

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O3

size_t flatbuffers::InlineAlignment(Type *type)

{
  size_t sVar1;
  
  sVar1 = 1;
  switch(type->base_type) {
  case BASE_TYPE_NONE:
  case BASE_TYPE_UTYPE:
  case BASE_TYPE_BOOL:
  case BASE_TYPE_CHAR:
  case BASE_TYPE_UCHAR:
    break;
  case BASE_TYPE_SHORT:
  case BASE_TYPE_USHORT:
switchD_00129d0c_caseD_5:
    sVar1 = 2;
    break;
  case BASE_TYPE_INT:
  case BASE_TYPE_UINT:
  case BASE_TYPE_FLOAT:
  case BASE_TYPE_STRING:
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_UNION:
switchD_00129d0c_caseD_7:
    sVar1 = 4;
    break;
  case BASE_TYPE_LONG:
  case BASE_TYPE_ULONG:
  case BASE_TYPE_DOUBLE:
  case BASE_TYPE_VECTOR64:
switchD_00129d0c_caseD_0:
    return 8;
  case BASE_TYPE_STRUCT:
switchD_00129d0c_caseD_f:
    if (type->struct_def->fixed != true) {
      return 4;
    }
    return type->struct_def->minalign;
  case BASE_TYPE_ARRAY:
    switch(type->element) {
    case BASE_TYPE_NONE:
    case BASE_TYPE_UTYPE:
    case BASE_TYPE_BOOL:
    case BASE_TYPE_CHAR:
    case BASE_TYPE_UCHAR:
      break;
    case BASE_TYPE_SHORT:
    case BASE_TYPE_USHORT:
      goto switchD_00129d0c_caseD_5;
    case BASE_TYPE_INT:
    case BASE_TYPE_UINT:
    case BASE_TYPE_FLOAT:
    case BASE_TYPE_STRING:
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_UNION:
    case BASE_TYPE_ARRAY:
      goto switchD_00129d0c_caseD_7;
    case BASE_TYPE_LONG:
    case BASE_TYPE_ULONG:
    case BASE_TYPE_DOUBLE:
    case BASE_TYPE_VECTOR64:
      goto switchD_00129d0c_caseD_0;
    case BASE_TYPE_STRUCT:
      goto switchD_00129d0c_caseD_f;
    default:
      goto switchD_00129d0c_default;
    }
  default:
switchD_00129d0c_default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                  ,0x9f,"size_t flatbuffers::SizeOf(const BaseType)");
  }
  return sVar1;
}

Assistant:

inline size_t InlineAlignment(const Type &type) {
  if (IsStruct(type)) {
    return type.struct_def->minalign;
  } else if (IsArray(type)) {
    return IsStruct(type.VectorType()) ? type.struct_def->minalign
                                       : SizeOf(type.element);
  } else {
    return SizeOf(type.base_type);
  }
}